

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O0

void wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::
     scan(MergeLocals *self,Expression **currp)

{
  Expression *this;
  Block *pBVar1;
  If *pIVar2;
  Loop *pLVar3;
  Break *pBVar4;
  Switch *pSVar5;
  Call *pCVar6;
  CallIndirect *pCVar7;
  LocalSet *pLVar8;
  GlobalSet *pGVar9;
  Load *pLVar10;
  Store *pSVar11;
  AtomicRMW *pAVar12;
  AtomicCmpxchg *pAVar13;
  AtomicWait *pAVar14;
  AtomicNotify *pAVar15;
  SIMDExtract *pSVar16;
  SIMDReplace *pSVar17;
  SIMDShuffle *pSVar18;
  SIMDTernary *pSVar19;
  SIMDShift *pSVar20;
  SIMDLoad *pSVar21;
  SIMDLoadStoreLane *pSVar22;
  MemoryInit *pMVar23;
  MemoryCopy *pMVar24;
  MemoryFill *pMVar25;
  Unary *pUVar26;
  Binary *pBVar27;
  Select *pSVar28;
  Drop *pDVar29;
  Return *pRVar30;
  MemoryGrow *pMVar31;
  RefIsNull *pRVar32;
  RefEq *pRVar33;
  TableGet *pTVar34;
  TableSet *pTVar35;
  TableGrow *pTVar36;
  Try *pTVar37;
  Throw *pTVar38;
  TupleMake *pTVar39;
  TupleExtract *pTVar40;
  I31New *pIVar41;
  I31Get *pIVar42;
  CallRef *pCVar43;
  RefTest *pRVar44;
  RefCast *pRVar45;
  BrOn *pBVar46;
  StructNew *pSVar47;
  StructGet *pSVar48;
  StructSet *pSVar49;
  ArrayNew *pAVar50;
  ArrayNewSeg *pAVar51;
  ArrayNewFixed *pAVar52;
  size_t sVar53;
  Expression **ppEVar54;
  ArrayGet *pAVar55;
  ArraySet *pAVar56;
  ArrayLen *pAVar57;
  ArrayCopy *pAVar58;
  ArrayFill *pAVar59;
  ArrayInit *pAVar60;
  RefAs *pRVar61;
  StringNew *pSVar62;
  StringMeasure *pSVar63;
  StringEncode *pSVar64;
  StringConcat *pSVar65;
  StringEq *pSVar66;
  StringAs *pSVar67;
  StringWTF8Advance *pSVar68;
  StringWTF16Get *pSVar69;
  StringIterNext *pSVar70;
  StringIterMove *pSVar71;
  StringSliceWTF *pSVar72;
  StringSliceIter *pSVar73;
  StringSliceIter *cast_84;
  StringSliceWTF *cast_83;
  StringIterMove *cast_82;
  StringIterNext *cast_81;
  StringWTF16Get *cast_80;
  StringWTF8Advance *cast_79;
  StringAs *cast_78;
  StringEq *cast_77;
  StringConcat *cast_76;
  StringEncode *cast_75;
  StringMeasure *cast_74;
  StringConst *cast_73;
  StringNew *cast_72;
  RefAs *cast_71;
  ArrayInit *cast_70;
  ArrayFill *cast_69;
  ArrayCopy *cast_68;
  ArrayLen *cast_67;
  ArraySet *cast_66;
  ArrayGet *cast_65;
  int i_8;
  ArrayNewFixed *cast_64;
  ArrayNewSeg *cast_63;
  ArrayNew *cast_62;
  StructSet *cast_61;
  StructGet *cast_60;
  int i_7;
  StructNew *cast_59;
  BrOn *cast_58;
  RefCast *cast_57;
  RefTest *cast_56;
  int i_6;
  CallRef *cast_55;
  I31Get *cast_54;
  I31New *cast_53;
  TupleExtract *cast_52;
  int i_5;
  TupleMake *cast_51;
  Pop *cast_50;
  Unreachable *cast_49;
  Nop *cast_48;
  Rethrow *cast_47;
  int i_4;
  Throw *cast_46;
  int i_3;
  Try *cast_45;
  TableGrow *cast_44;
  TableSize *cast_43;
  TableSet *cast_42;
  TableGet *cast_41;
  RefEq *cast_40;
  RefFunc *cast_39;
  RefIsNull *cast_38;
  RefNull *cast_37;
  MemoryGrow *cast_36;
  MemorySize *cast_35;
  Return *cast_34;
  Drop *cast_33;
  Select *cast_32;
  Binary *cast_31;
  Unary *cast_30;
  Const *cast_29;
  MemoryFill *cast_28;
  MemoryCopy *cast_27;
  DataDrop *cast_26;
  MemoryInit *cast_25;
  SIMDLoadStoreLane *cast_24;
  SIMDLoad *cast_23;
  SIMDShift *cast_22;
  SIMDTernary *cast_21;
  SIMDShuffle *cast_20;
  SIMDReplace *cast_19;
  SIMDExtract *cast_18;
  AtomicFence *cast_17;
  AtomicNotify *cast_16;
  AtomicWait *cast_15;
  AtomicCmpxchg *cast_14;
  AtomicRMW *cast_13;
  Store *cast_12;
  Load *cast_11;
  GlobalSet *cast_10;
  GlobalGet *cast_9;
  LocalSet *cast_8;
  LocalGet *cast_7;
  int i_2;
  CallIndirect *cast_6;
  int i_1;
  Call *cast_5;
  Switch *cast_4;
  Break *cast_3;
  Loop *cast_2;
  If *cast_1;
  int i;
  Block *cast;
  Expression *curr;
  Expression **currp_local;
  MergeLocals *self_local;
  
  this = *currp;
  switch(this->_id) {
  case InvalidId:
  case NumExpressionIds:
    handle_unreachable("unexpected expression type",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-delegations-fields.def"
                       ,0xb0);
  case BlockId:
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                ::doVisitBlock,currp);
    pBVar1 = Expression::cast<wasm::Block>(this);
    sVar53 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                       (&(pBVar1->list).
                         super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>)
    ;
    cast_1._4_4_ = (int)sVar53;
    while (cast_1._4_4_ = cast_1._4_4_ + -1, -1 < cast_1._4_4_) {
      ppEVar54 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           (&(pBVar1->list).
                             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                            ,(long)cast_1._4_4_);
      Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
                (&(self->
                  super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                  ).
                  super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                  .
                  super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                 ,scan,ppEVar54);
    }
    break;
  case IfId:
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                ::doVisitIf,currp);
    pIVar2 = Expression::cast<wasm::If>(this);
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::
    maybePushTask(&(self->
                   super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                   ).
                   super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                   .
                   super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                  ,scan,&pIVar2->ifFalse);
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,scan,&pIVar2->ifTrue);
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,scan,&pIVar2->condition);
    break;
  case LoopId:
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                ::doVisitLoop,currp);
    pLVar3 = Expression::cast<wasm::Loop>(this);
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,scan,&pLVar3->body);
    break;
  case BreakId:
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                ::doVisitBreak,currp);
    pBVar4 = Expression::cast<wasm::Break>(this);
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::
    maybePushTask(&(self->
                   super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                   ).
                   super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                   .
                   super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                  ,scan,&pBVar4->condition);
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::
    maybePushTask(&(self->
                   super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                   ).
                   super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                   .
                   super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                  ,scan,&pBVar4->value);
    break;
  case SwitchId:
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                ::doVisitSwitch,currp);
    pSVar5 = Expression::cast<wasm::Switch>(this);
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,scan,&pSVar5->condition);
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::
    maybePushTask(&(self->
                   super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                   ).
                   super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                   .
                   super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                  ,scan,&pSVar5->value);
    break;
  case CallId:
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                ::doVisitCall,currp);
    pCVar6 = Expression::cast<wasm::Call>(this);
    sVar53 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                       (&(pCVar6->operands).
                         super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>)
    ;
    cast_6._4_4_ = (int)sVar53;
    while (cast_6._4_4_ = cast_6._4_4_ + -1, -1 < cast_6._4_4_) {
      ppEVar54 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           (&(pCVar6->operands).
                             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                            ,(long)cast_6._4_4_);
      Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
                (&(self->
                  super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                  ).
                  super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                  .
                  super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                 ,scan,ppEVar54);
    }
    break;
  case CallIndirectId:
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                ::doVisitCallIndirect,currp);
    pCVar7 = Expression::cast<wasm::CallIndirect>(this);
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,scan,&pCVar7->target);
    sVar53 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                       (&(pCVar7->operands).
                         super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>)
    ;
    cast_7._4_4_ = (int)sVar53;
    while (cast_7._4_4_ = cast_7._4_4_ + -1, -1 < cast_7._4_4_) {
      ppEVar54 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           (&(pCVar7->operands).
                             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                            ,(long)cast_7._4_4_);
      Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
                (&(self->
                  super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                  ).
                  super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                  .
                  super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                 ,scan,ppEVar54);
    }
    break;
  case LocalGetId:
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                ::doVisitLocalGet,currp);
    Expression::cast<wasm::LocalGet>(this);
    break;
  case LocalSetId:
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                ::doVisitLocalSet,currp);
    pLVar8 = Expression::cast<wasm::LocalSet>(this);
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,scan,&pLVar8->value);
    break;
  case GlobalGetId:
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                ::doVisitGlobalGet,currp);
    Expression::cast<wasm::GlobalGet>(this);
    break;
  case GlobalSetId:
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                ::doVisitGlobalSet,currp);
    pGVar9 = Expression::cast<wasm::GlobalSet>(this);
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,scan,&pGVar9->value);
    break;
  case LoadId:
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                ::doVisitLoad,currp);
    pLVar10 = Expression::cast<wasm::Load>(this);
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,scan,&pLVar10->ptr);
    break;
  case StoreId:
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                ::doVisitStore,currp);
    pSVar11 = Expression::cast<wasm::Store>(this);
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,scan,&pSVar11->value);
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,scan,&pSVar11->ptr);
    break;
  case ConstId:
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                ::doVisitConst,currp);
    Expression::cast<wasm::Const>(this);
    break;
  case UnaryId:
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                ::doVisitUnary,currp);
    pUVar26 = Expression::cast<wasm::Unary>(this);
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,scan,&pUVar26->value);
    break;
  case BinaryId:
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                ::doVisitBinary,currp);
    pBVar27 = Expression::cast<wasm::Binary>(this);
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,scan,&pBVar27->right);
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,scan,&pBVar27->left);
    break;
  case SelectId:
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                ::doVisitSelect,currp);
    pSVar28 = Expression::cast<wasm::Select>(this);
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,scan,&pSVar28->condition);
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,scan,&pSVar28->ifFalse);
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,scan,&pSVar28->ifTrue);
    break;
  case DropId:
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                ::doVisitDrop,currp);
    pDVar29 = Expression::cast<wasm::Drop>(this);
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,scan,&pDVar29->value);
    break;
  case ReturnId:
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                ::doVisitReturn,currp);
    pRVar30 = Expression::cast<wasm::Return>(this);
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::
    maybePushTask(&(self->
                   super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                   ).
                   super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                   .
                   super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                  ,scan,&pRVar30->value);
    break;
  case MemorySizeId:
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                ::doVisitMemorySize,currp);
    Expression::cast<wasm::MemorySize>(this);
    break;
  case MemoryGrowId:
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                ::doVisitMemoryGrow,currp);
    pMVar31 = Expression::cast<wasm::MemoryGrow>(this);
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,scan,&pMVar31->delta);
    break;
  case NopId:
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                ::doVisitNop,currp);
    Expression::cast<wasm::Nop>(this);
    break;
  case UnreachableId:
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                ::doVisitUnreachable,currp);
    Expression::cast<wasm::Unreachable>(this);
    break;
  case AtomicRMWId:
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                ::doVisitAtomicRMW,currp);
    pAVar12 = Expression::cast<wasm::AtomicRMW>(this);
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,scan,&pAVar12->value);
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,scan,&pAVar12->ptr);
    break;
  case AtomicCmpxchgId:
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                ::doVisitAtomicCmpxchg,currp);
    pAVar13 = Expression::cast<wasm::AtomicCmpxchg>(this);
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,scan,&pAVar13->replacement);
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,scan,&pAVar13->expected);
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,scan,&pAVar13->ptr);
    break;
  case AtomicWaitId:
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                ::doVisitAtomicWait,currp);
    pAVar14 = Expression::cast<wasm::AtomicWait>(this);
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,scan,&pAVar14->timeout);
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,scan,&pAVar14->expected);
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,scan,&pAVar14->ptr);
    break;
  case AtomicNotifyId:
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                ::doVisitAtomicNotify,currp);
    pAVar15 = Expression::cast<wasm::AtomicNotify>(this);
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,scan,&pAVar15->notifyCount);
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,scan,&pAVar15->ptr);
    break;
  case AtomicFenceId:
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                ::doVisitAtomicFence,currp);
    Expression::cast<wasm::AtomicFence>(this);
    break;
  case SIMDExtractId:
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                ::doVisitSIMDExtract,currp);
    pSVar16 = Expression::cast<wasm::SIMDExtract>(this);
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,scan,&pSVar16->vec);
    break;
  case SIMDReplaceId:
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                ::doVisitSIMDReplace,currp);
    pSVar17 = Expression::cast<wasm::SIMDReplace>(this);
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,scan,&pSVar17->value);
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,scan,&pSVar17->vec);
    break;
  case SIMDShuffleId:
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                ::doVisitSIMDShuffle,currp);
    pSVar18 = Expression::cast<wasm::SIMDShuffle>(this);
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,scan,&pSVar18->right);
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,scan,&pSVar18->left);
    break;
  case SIMDTernaryId:
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                ::doVisitSIMDTernary,currp);
    pSVar19 = Expression::cast<wasm::SIMDTernary>(this);
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,scan,&pSVar19->c);
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,scan,&pSVar19->b);
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,scan,&pSVar19->a);
    break;
  case SIMDShiftId:
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                ::doVisitSIMDShift,currp);
    pSVar20 = Expression::cast<wasm::SIMDShift>(this);
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,scan,&pSVar20->shift);
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,scan,&pSVar20->vec);
    break;
  case SIMDLoadId:
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                ::doVisitSIMDLoad,currp);
    pSVar21 = Expression::cast<wasm::SIMDLoad>(this);
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,scan,&pSVar21->ptr);
    break;
  case SIMDLoadStoreLaneId:
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                ::doVisitSIMDLoadStoreLane,currp);
    pSVar22 = Expression::cast<wasm::SIMDLoadStoreLane>(this);
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,scan,&pSVar22->vec);
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,scan,&pSVar22->ptr);
    break;
  case MemoryInitId:
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                ::doVisitMemoryInit,currp);
    pMVar23 = Expression::cast<wasm::MemoryInit>(this);
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,scan,&pMVar23->size);
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,scan,&pMVar23->offset);
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,scan,&pMVar23->dest);
    break;
  case DataDropId:
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                ::doVisitDataDrop,currp);
    Expression::cast<wasm::DataDrop>(this);
    break;
  case MemoryCopyId:
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                ::doVisitMemoryCopy,currp);
    pMVar24 = Expression::cast<wasm::MemoryCopy>(this);
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,scan,&pMVar24->size);
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,scan,&pMVar24->source);
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,scan,&pMVar24->dest);
    break;
  case MemoryFillId:
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                ::doVisitMemoryFill,currp);
    pMVar25 = Expression::cast<wasm::MemoryFill>(this);
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,scan,&pMVar25->size);
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,scan,&pMVar25->value);
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,scan,&pMVar25->dest);
    break;
  case PopId:
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                ::doVisitPop,currp);
    Expression::cast<wasm::Pop>(this);
    break;
  case RefNullId:
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                ::doVisitRefNull,currp);
    Expression::cast<wasm::RefNull>(this);
    break;
  case RefIsNullId:
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                ::doVisitRefIsNull,currp);
    pRVar32 = Expression::cast<wasm::RefIsNull>(this);
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,scan,&pRVar32->value);
    break;
  case RefFuncId:
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                ::doVisitRefFunc,currp);
    Expression::cast<wasm::RefFunc>(this);
    break;
  case RefEqId:
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                ::doVisitRefEq,currp);
    pRVar33 = Expression::cast<wasm::RefEq>(this);
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,scan,&pRVar33->right);
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,scan,&pRVar33->left);
    break;
  case TableGetId:
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                ::doVisitTableGet,currp);
    pTVar34 = Expression::cast<wasm::TableGet>(this);
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,scan,&pTVar34->index);
    break;
  case TableSetId:
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                ::doVisitTableSet,currp);
    pTVar35 = Expression::cast<wasm::TableSet>(this);
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,scan,&pTVar35->value);
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,scan,&pTVar35->index);
    break;
  case TableSizeId:
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                ::doVisitTableSize,currp);
    Expression::cast<wasm::TableSize>(this);
    break;
  case TableGrowId:
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                ::doVisitTableGrow,currp);
    pTVar36 = Expression::cast<wasm::TableGrow>(this);
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,scan,&pTVar36->delta);
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,scan,&pTVar36->value);
    break;
  case TryId:
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                ::doVisitTry,currp);
    pTVar37 = Expression::cast<wasm::Try>(this);
    sVar53 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                       (&(pTVar37->catchBodies).
                         super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>)
    ;
    cast_46._4_4_ = (int)sVar53;
    while (cast_46._4_4_ = cast_46._4_4_ + -1, -1 < cast_46._4_4_) {
      ppEVar54 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           (&(pTVar37->catchBodies).
                             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                            ,(long)cast_46._4_4_);
      Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
                (&(self->
                  super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                  ).
                  super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                  .
                  super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                 ,scan,ppEVar54);
    }
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,scan,&pTVar37->body);
    break;
  case ThrowId:
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                ::doVisitThrow,currp);
    pTVar38 = Expression::cast<wasm::Throw>(this);
    sVar53 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                       (&(pTVar38->operands).
                         super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>)
    ;
    cast_47._4_4_ = (int)sVar53;
    while (cast_47._4_4_ = cast_47._4_4_ + -1, -1 < cast_47._4_4_) {
      ppEVar54 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           (&(pTVar38->operands).
                             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                            ,(long)cast_47._4_4_);
      Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
                (&(self->
                  super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                  ).
                  super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                  .
                  super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                 ,scan,ppEVar54);
    }
    break;
  case RethrowId:
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                ::doVisitRethrow,currp);
    Expression::cast<wasm::Rethrow>(this);
    break;
  case TupleMakeId:
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                ::doVisitTupleMake,currp);
    pTVar39 = Expression::cast<wasm::TupleMake>(this);
    sVar53 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                       (&(pTVar39->operands).
                         super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>)
    ;
    cast_52._4_4_ = (int)sVar53;
    while (cast_52._4_4_ = cast_52._4_4_ + -1, -1 < cast_52._4_4_) {
      ppEVar54 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           (&(pTVar39->operands).
                             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                            ,(long)cast_52._4_4_);
      Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
                (&(self->
                  super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                  ).
                  super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                  .
                  super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                 ,scan,ppEVar54);
    }
    break;
  case TupleExtractId:
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                ::doVisitTupleExtract,currp);
    pTVar40 = Expression::cast<wasm::TupleExtract>(this);
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,scan,&pTVar40->tuple);
    break;
  case I31NewId:
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                ::doVisitI31New,currp);
    pIVar41 = Expression::cast<wasm::I31New>(this);
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,scan,&pIVar41->value);
    break;
  case I31GetId:
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                ::doVisitI31Get,currp);
    pIVar42 = Expression::cast<wasm::I31Get>(this);
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,scan,&pIVar42->i31);
    break;
  case CallRefId:
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                ::doVisitCallRef,currp);
    pCVar43 = Expression::cast<wasm::CallRef>(this);
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,scan,&pCVar43->target);
    sVar53 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                       (&(pCVar43->operands).
                         super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>)
    ;
    cast_56._4_4_ = (int)sVar53;
    while (cast_56._4_4_ = cast_56._4_4_ + -1, -1 < cast_56._4_4_) {
      ppEVar54 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           (&(pCVar43->operands).
                             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                            ,(long)cast_56._4_4_);
      Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
                (&(self->
                  super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                  ).
                  super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                  .
                  super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                 ,scan,ppEVar54);
    }
    break;
  case RefTestId:
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                ::doVisitRefTest,currp);
    pRVar44 = Expression::cast<wasm::RefTest>(this);
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,scan,&pRVar44->ref);
    break;
  case RefCastId:
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                ::doVisitRefCast,currp);
    pRVar45 = Expression::cast<wasm::RefCast>(this);
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,scan,&pRVar45->ref);
    break;
  case BrOnId:
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                ::doVisitBrOn,currp);
    pBVar46 = Expression::cast<wasm::BrOn>(this);
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,scan,&pBVar46->ref);
    break;
  case StructNewId:
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                ::doVisitStructNew,currp);
    pSVar47 = Expression::cast<wasm::StructNew>(this);
    sVar53 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                       (&(pSVar47->operands).
                         super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>)
    ;
    cast_60._4_4_ = (int)sVar53;
    while (cast_60._4_4_ = cast_60._4_4_ + -1, -1 < cast_60._4_4_) {
      ppEVar54 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           (&(pSVar47->operands).
                             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                            ,(long)cast_60._4_4_);
      Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
                (&(self->
                  super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                  ).
                  super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                  .
                  super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                 ,scan,ppEVar54);
    }
    break;
  case StructGetId:
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                ::doVisitStructGet,currp);
    pSVar48 = Expression::cast<wasm::StructGet>(this);
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,scan,&pSVar48->ref);
    break;
  case StructSetId:
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                ::doVisitStructSet,currp);
    pSVar49 = Expression::cast<wasm::StructSet>(this);
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,scan,&pSVar49->value);
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,scan,&pSVar49->ref);
    break;
  case ArrayNewId:
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                ::doVisitArrayNew,currp);
    pAVar50 = Expression::cast<wasm::ArrayNew>(this);
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,scan,&pAVar50->size);
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::
    maybePushTask(&(self->
                   super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                   ).
                   super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                   .
                   super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                  ,scan,&pAVar50->init);
    break;
  case ArrayNewSegId:
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                ::doVisitArrayNewSeg,currp);
    pAVar51 = Expression::cast<wasm::ArrayNewSeg>(this);
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,scan,&pAVar51->size);
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,scan,&pAVar51->offset);
    break;
  case ArrayNewFixedId:
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                ::doVisitArrayNewFixed,currp);
    pAVar52 = Expression::cast<wasm::ArrayNewFixed>(this);
    sVar53 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                       (&(pAVar52->values).
                         super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>)
    ;
    cast_65._4_4_ = (int)sVar53;
    while (cast_65._4_4_ = cast_65._4_4_ + -1, -1 < cast_65._4_4_) {
      ppEVar54 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           (&(pAVar52->values).
                             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                            ,(long)cast_65._4_4_);
      Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
                (&(self->
                  super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                  ).
                  super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                  .
                  super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                 ,scan,ppEVar54);
    }
    break;
  case ArrayGetId:
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                ::doVisitArrayGet,currp);
    pAVar55 = Expression::cast<wasm::ArrayGet>(this);
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,scan,&pAVar55->index);
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,scan,&pAVar55->ref);
    break;
  case ArraySetId:
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                ::doVisitArraySet,currp);
    pAVar56 = Expression::cast<wasm::ArraySet>(this);
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,scan,&pAVar56->value);
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,scan,&pAVar56->index);
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,scan,&pAVar56->ref);
    break;
  case ArrayLenId:
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                ::doVisitArrayLen,currp);
    pAVar57 = Expression::cast<wasm::ArrayLen>(this);
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,scan,&pAVar57->ref);
    break;
  case ArrayCopyId:
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                ::doVisitArrayCopy,currp);
    pAVar58 = Expression::cast<wasm::ArrayCopy>(this);
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,scan,&pAVar58->length);
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,scan,&pAVar58->srcIndex);
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,scan,&pAVar58->srcRef);
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,scan,&pAVar58->destIndex);
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,scan,&pAVar58->destRef);
    break;
  case ArrayFillId:
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                ::doVisitArrayFill,currp);
    pAVar59 = Expression::cast<wasm::ArrayFill>(this);
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,scan,&pAVar59->size);
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,scan,&pAVar59->value);
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,scan,&pAVar59->index);
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,scan,&pAVar59->ref);
    break;
  case ArrayInitId:
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                ::doVisitArrayInit,currp);
    pAVar60 = Expression::cast<wasm::ArrayInit>(this);
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,scan,&pAVar60->size);
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,scan,&pAVar60->offset);
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,scan,&pAVar60->index);
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,scan,&pAVar60->ref);
    break;
  case RefAsId:
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                ::doVisitRefAs,currp);
    pRVar61 = Expression::cast<wasm::RefAs>(this);
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,scan,&pRVar61->value);
    break;
  case StringNewId:
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                ::doVisitStringNew,currp);
    pSVar62 = Expression::cast<wasm::StringNew>(this);
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::
    maybePushTask(&(self->
                   super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                   ).
                   super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                   .
                   super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                  ,scan,&pSVar62->end);
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::
    maybePushTask(&(self->
                   super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                   ).
                   super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                   .
                   super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                  ,scan,&pSVar62->start);
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::
    maybePushTask(&(self->
                   super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                   ).
                   super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                   .
                   super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                  ,scan,&pSVar62->length);
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,scan,&pSVar62->ptr);
    break;
  case StringConstId:
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                ::doVisitStringConst,currp);
    Expression::cast<wasm::StringConst>(this);
    break;
  case StringMeasureId:
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                ::doVisitStringMeasure,currp);
    pSVar63 = Expression::cast<wasm::StringMeasure>(this);
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,scan,&pSVar63->ref);
    break;
  case StringEncodeId:
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                ::doVisitStringEncode,currp);
    pSVar64 = Expression::cast<wasm::StringEncode>(this);
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::
    maybePushTask(&(self->
                   super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                   ).
                   super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                   .
                   super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                  ,scan,&pSVar64->start);
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,scan,&pSVar64->ptr);
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,scan,&pSVar64->ref);
    break;
  case StringConcatId:
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                ::doVisitStringConcat,currp);
    pSVar65 = Expression::cast<wasm::StringConcat>(this);
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,scan,&pSVar65->right);
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,scan,&pSVar65->left);
    break;
  case StringEqId:
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                ::doVisitStringEq,currp);
    pSVar66 = Expression::cast<wasm::StringEq>(this);
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,scan,&pSVar66->right);
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,scan,&pSVar66->left);
    break;
  case StringAsId:
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                ::doVisitStringAs,currp);
    pSVar67 = Expression::cast<wasm::StringAs>(this);
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,scan,&pSVar67->ref);
    break;
  case StringWTF8AdvanceId:
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                ::doVisitStringWTF8Advance,currp);
    pSVar68 = Expression::cast<wasm::StringWTF8Advance>(this);
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,scan,&pSVar68->bytes);
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,scan,&pSVar68->pos);
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,scan,&pSVar68->ref);
    break;
  case StringWTF16GetId:
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                ::doVisitStringWTF16Get,currp);
    pSVar69 = Expression::cast<wasm::StringWTF16Get>(this);
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,scan,&pSVar69->pos);
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,scan,&pSVar69->ref);
    break;
  case StringIterNextId:
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                ::doVisitStringIterNext,currp);
    pSVar70 = Expression::cast<wasm::StringIterNext>(this);
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,scan,&pSVar70->ref);
    break;
  case StringIterMoveId:
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                ::doVisitStringIterMove,currp);
    pSVar71 = Expression::cast<wasm::StringIterMove>(this);
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,scan,&pSVar71->num);
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,scan,&pSVar71->ref);
    break;
  case StringSliceWTFId:
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                ::doVisitStringSliceWTF,currp);
    pSVar72 = Expression::cast<wasm::StringSliceWTF>(this);
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,scan,&pSVar72->end);
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,scan,&pSVar72->start);
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,scan,&pSVar72->ref);
    break;
  case StringSliceIterId:
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                ::doVisitStringSliceIter,currp);
    pSVar73 = Expression::cast<wasm::StringSliceIter>(this);
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,scan,&pSVar73->num);
    Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                ).
                super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                .
                super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
               ,scan,&pSVar73->ref);
  }
  return;
}

Assistant:

static void scan(SubType* self, Expression** currp) {
    Expression* curr = *currp;

#define DELEGATE_ID curr->_id

#define DELEGATE_START(id)                                                     \
  self->pushTask(SubType::doVisit##id, currp);                                 \
  [[maybe_unused]] auto* cast = curr->cast<id>();

#define DELEGATE_GET_FIELD(id, field) cast->field

#define DELEGATE_FIELD_CHILD(id, field)                                        \
  self->pushTask(SubType::scan, &cast->field);

#define DELEGATE_FIELD_OPTIONAL_CHILD(id, field)                               \
  self->maybePushTask(SubType::scan, &cast->field);

#define DELEGATE_FIELD_INT(id, field)
#define DELEGATE_FIELD_INT_ARRAY(id, field)
#define DELEGATE_FIELD_LITERAL(id, field)
#define DELEGATE_FIELD_NAME(id, field)
#define DELEGATE_FIELD_NAME_VECTOR(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_DEF(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_USE(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_USE_VECTOR(id, field)
#define DELEGATE_FIELD_TYPE(id, field)
#define DELEGATE_FIELD_HEAPTYPE(id, field)
#define DELEGATE_FIELD_ADDRESS(id, field)

#include "wasm-delegations-fields.def"
  }